

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O2

void lowbd_fwd_txfm2d_64x32_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  char cVar1;
  transform_1d_avx2_conflict1 p_Var2;
  undefined1 auVar3 [32];
  int8_t *piVar4;
  undefined7 in_register_00000009;
  transform_1d_avx2_conflict1 p_Var5;
  __m256i *palVar6;
  int i;
  long lVar7;
  undefined1 *puVar8;
  __m256i *out;
  long lVar9;
  __m256i bufB [64];
  __m256i bufA [64];
  __m256i buf0 [64];
  __m256i buf1 [256];
  longlong local_3860 [256];
  longlong local_3060 [256];
  longlong local_2860 [256];
  longlong local_2060 [2];
  undefined1 local_2050 [8224];
  
  piVar4 = av1_fwd_txfm_shift_ls[0xc];
  p_Var2 = col_txfm16x32_arr[CONCAT71(in_register_00000009,tx_type) & 0xffffffff];
  palVar6 = (__m256i *)local_2060;
  p_Var5 = p_Var2;
  for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
    p_Var5 = (transform_1d_avx2_conflict1)0x20;
    load_buffer_16bit_to_16bit_avx2(input + lVar7 * 0x10,stride,(__m256i *)local_2860,0x20);
    round_shift_16bit_w16_avx2((__m256i *)local_2860,0x20,(int)*piVar4);
    (*p_Var2)((__m256i *)local_2860,(__m256i *)local_2860,'\f');
    round_shift_16bit_w16_avx2((__m256i *)local_2860,0x20,(int)piVar4[1]);
    out = palVar6;
    for (lVar9 = 0; lVar9 != 0x400; lVar9 = lVar9 + 0x200) {
      transpose_16bit_16x16_avx2((__m256i *)((long)local_2860 + lVar9),out);
      out = out + 0x40;
    }
    palVar6 = palVar6 + 0x10;
  }
  puVar8 = local_2050;
  for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
    for (lVar9 = 0; lVar9 != 0x800; lVar9 = lVar9 + 0x20) {
      auVar3 = vpmovsxwd_avx2(*(undefined1 (*) [16])(puVar8 + lVar9 + -0x10));
      *(undefined1 (*) [32])((long)local_3060 + lVar9) = auVar3;
      auVar3 = vpmovsxwd_avx2(*(undefined1 (*) [16])(puVar8 + lVar9));
      *(undefined1 (*) [32])((long)local_3860 + lVar9) = auVar3;
    }
    fdct64_new_avx2((__m256i *)local_3060,(__m256i *)local_3060,'\v');
    fdct64_new_avx2((__m256i *)local_3860,(__m256i *)local_3860,'\v');
    cVar1 = piVar4[2];
    round_shift_rect_array_32_avx2
              ((__m256i *)local_3060,(__m256i *)local_3060,-(int)cVar1,(int)p_Var5,bd);
    round_shift_rect_array_32_avx2
              ((__m256i *)local_3860,(__m256i *)local_3860,-(int)cVar1,(int)p_Var5,bd);
    store_output_32bit_w16
              (output + lVar7 * 0x10,(__m256i *)local_3060,(__m256i *)local_3860,(int)p_Var5,bd);
    puVar8 = puVar8 + 0x800;
  }
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_64x32_avx2(const int16_t *input, int32_t *output,
                                        int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  const TX_SIZE tx_size = TX_64X32;
  __m256i buf0[64], buf1[256];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = col_txfm16x32_arr[tx_type];
  const int width_div16 = (width >> 4);
  const int height_div16 = (height >> 4);

  for (int i = 0; i < width_div16; i++) {
    load_buffer_16bit_to_16bit_avx2(input + 16 * i, stride, buf0, height);
    round_shift_16bit_w16_avx2(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit_w16_avx2(buf0, height, shift[1]);
    for (int j = 0; j < AOMMIN(4, height_div16); ++j) {
      transpose_16bit_16x16_avx2(buf0 + j * 16, buf1 + j * width + 16 * i);
    }
  }
  assert(tx_type == DCT_DCT);
  for (int i = 0; i < AOMMIN(2, height_div16); i++) {
    __m256i bufA[64];
    __m256i bufB[64];
    __m128i *buf = (__m128i *)(buf1 + width * i);
    for (int j = 0; j < width; ++j) {
      bufA[j] = _mm256_cvtepi16_epi32(buf[j * 2]);
      bufB[j] = _mm256_cvtepi16_epi32(buf[j * 2 + 1]);
    }
    fdct64_new_avx2(bufA, bufA, cos_bit_row);
    fdct64_new_avx2(bufB, bufB, cos_bit_row);
    round_shift_rect_array_32_avx2(bufA, bufA, 32, -shift[2], NewSqrt2);
    round_shift_rect_array_32_avx2(bufB, bufB, 32, -shift[2], NewSqrt2);

    store_output_32bit_w16(output + i * 16, bufA, bufB, 32, 32);
  }
}